

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

char __thiscall TidyConfigParser::peekChar(TidyConfigParser *this)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 local_1;
  
  while( true ) {
    iVar1 = std::istream::peek();
    bVar3 = true;
    if (iVar1 != 0x20) {
      iVar1 = std::istream::peek();
      bVar3 = iVar1 == 9;
    }
    if (!bVar3) break;
    std::istream::get();
  }
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) == 0) {
    local_1 = std::istream::peek();
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

inline char TidyConfigParser::peekChar() {
    while (fileStream.peek() == ' ' || fileStream.peek() == '\t') {
        fileStream.get();
    }
    if (fileStream.eof())
        return 0;
#if defined(_WIN32)
    char ret = fileStream.peek();
    if (ret == '\r') {
        fileStream.get();
        if (fileStream.peek() == '\n') {
            ret = '\n';
        }
        fileStream.unget();
    }
    return ret;
#elif defined(_MACOS)
    char ret = fileStream.peek();
    if (ret == '\r')
        ret = '\n';
    return ret;
#else
    return static_cast<char>(fileStream.peek());
#endif
}